

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quuid.cpp
# Opt level: O2

QUuid __thiscall QUuid::fromString(QUuid *this,QAnyStringView text)

{
  long in_FS_OFFSET;
  QUuid QVar1;
  QLatin1StringView text_00;
  
  text_00.m_size = (ulong)text.field_0.m_data & 0x3fffffffffffffff;
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  text_00.m_data = (char *)this;
  QVar1 = uuidFromString(text_00);
  return QVar1;
}

Assistant:

QUuid QUuid::fromString(QAnyStringView text) noexcept
{
    return text.visit([] (auto text) { return uuidFromString(text); });
}